

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

void __thiscall ON_wString::CopyToArray(ON_wString *this,int size,wchar_t *s)

{
  wchar_t *__dest;
  ulong array_capacity;
  ON_Internal_Empty_wString *memblock;
  
  if (size < 0) {
    size = L'\0';
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
               ,0x21c,"","Requested size > ON_wString::MaximumStringLength.");
  }
  if ((s == (wchar_t *)0x0 || size == L'\0') || (*s == L'\0')) {
    Destroy(this);
    this->m_s = (wchar_t *)0x8431fc;
  }
  else {
    memblock = (ON_Internal_Empty_wString *)(this->m_s + -3);
    if (this->m_s == (wchar_t *)0x0) {
      memblock = &empty_wstring;
    }
    this->m_s = (wchar_t *)0x8431fc;
    array_capacity = (ulong)(uint)size;
    ReserveArray(this,array_capacity);
    __dest = this->m_s;
    if (__dest != &empty_wstring.s && __dest != (wchar_t *)0x0) {
      memcpy(__dest,s,array_capacity * 4);
      __dest[-2] = size;
      this->m_s[array_capacity] = L'\0';
    }
    if (memblock != &empty_wstring) {
      LOCK();
      (memblock->header).ref_count.super___atomic_base<int>._M_i =
           (memblock->header).ref_count.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((memblock->header).ref_count.super___atomic_base<int>._M_i == 0) {
        (memblock->header).string_length = 0;
        (memblock->header).string_capacity = 0;
        onfree(memblock);
        return;
      }
    }
  }
  return;
}

Assistant:

void ON_wString::CopyToArray( int size, const wchar_t* s )
{
  if (size > ON_wString::MaximumStringLength)
  {
    ON_ERROR("Requested size > ON_wString::MaximumStringLength.");
    size = 0;
  }

  if ( size > 0 && s && s[0] )
  {
    ON_wStringHeader* hdr0 = Header();
    // Calling Create() here preserves hdr0 in case s is in its m_s[] buffer.
    Create();

    // ReserveArray() will allocate a new header
	  ReserveArray(size);
    ON_wStringHeader* hdr1 = Header();
    if (nullptr != hdr1 && hdr1 != pEmptyStringHeader)
    {
      memcpy(m_s, s, size * sizeof(*m_s));
      hdr1->string_length = size;
      m_s[hdr1->string_length] = 0;
    }
    // "this" no longer requires access to the original header
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr0);
  }
  else
  {
    Destroy();
    Create();
  }
}